

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

int Gia_ManFraigCheckCis(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  int iVar4;
  
  if (((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xdf,"int Gia_ManFraigCheckCis(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar2 = p->pObjs;
  lVar3 = (long)pObj - (long)pGVar2;
  while( true ) {
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = (int)(lVar3 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar4) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[iVar4] == p->nTravIds) break;
    pGVar1 = pObj + -1;
    pObj = pObj + -1;
    lVar3 = lVar3 + -0xc;
    if (((undefined1  [12])*pGVar1 & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff)
    {
      return 0;
    }
  }
  return 1;
}

Assistant:

int Gia_ManFraigCheckCis( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    for ( assert( Gia_ObjIsCi(pObj) ); Gia_ObjIsCi(pObj); pObj-- )
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            return 1;
    return 0;
}